

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderExecUtil::ComputeShaderExecutor::ComputeShaderExecutor
          (ComputeShaderExecutor *this,RenderContext *renderCtx,ShaderSpec *shaderSpec)

{
  ProgramSources *sources;
  ShaderSpec *spec;
  string sStack_138;
  undefined1 local_118 [40];
  ProgramSources local_f0;
  
  memset(&local_f0,0,0xac);
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f0._193_8_ = 0;
  generateComputeShader_abi_cxx11_(&sStack_138,(ComputeShaderExecutor *)shaderSpec,spec);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_118,&sStack_138);
  sources = glu::ProgramSources::operator<<(&local_f0,(ShaderSource *)local_118);
  BufferIoExecutor::BufferIoExecutor(&this->super_BufferIoExecutor,renderCtx,shaderSpec,sources);
  std::__cxx11::string::~string((string *)(local_118 + 8));
  std::__cxx11::string::~string((string *)&sStack_138);
  glu::ProgramSources::~ProgramSources(&local_f0);
  (this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor =
       (_func_int **)&PTR__TessControlExecutor_01e77378;
  tcu::Vector<int,_3>::Vector(&this->m_maxWorkSize);
  (this->m_maxWorkSize).m_data[0] = 0x80;
  (this->m_maxWorkSize).m_data[1] = 0x80;
  (this->m_maxWorkSize).m_data[2] = 0x40;
  return;
}

Assistant:

ComputeShaderExecutor::ComputeShaderExecutor (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec)
	: BufferIoExecutor	(renderCtx, shaderSpec,
						 glu::ProgramSources() << glu::ComputeSource(generateComputeShader(shaderSpec)))
{
	m_maxWorkSize	= tcu::IVec3(128,128,64); // Minimum in 3plus
}